

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O0

uint32_t __thiscall PatchCredits::inject_func_choose_ending_palette(PatchCredits *this,ROM *rom)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  initializer_list<md::DataRegister> __l_04;
  size_t this_00;
  uint32_t uVar1;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  AddressRegister local_538;
  allocator<char> local_521;
  string local_520;
  Param local_500 [2];
  allocator<md::AddressRegister> local_4e9;
  AddressRegister local_4e8;
  AddressRegister local_4d8;
  iterator local_4c8;
  size_type local_4c0;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_4b8;
  allocator<md::DataRegister> local_499;
  DataRegister local_498;
  DataRegister local_488;
  iterator local_478;
  size_type local_470;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_468;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  AddressRegister local_400;
  allocator<md::AddressRegister> local_3e9;
  AddressRegister local_3e8;
  AddressRegister local_3d8;
  iterator local_3c8;
  size_type local_3c0;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_3b8;
  allocator<md::DataRegister> local_399;
  DataRegister local_398;
  DataRegister local_388;
  iterator local_378;
  size_type local_370;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_368;
  allocator<char> local_349;
  string local_348;
  AddressRegister local_328;
  allocator<char> local_311;
  string local_310;
  DataRegister local_2f0;
  DataRegister local_2e0;
  DataRegister local_2d0;
  DataRegister local_2c0;
  DataRegister local_2b0;
  AddressRegister local_2a0;
  AddressInRegister local_290;
  DataRegister local_270;
  AddressRegister local_260;
  AddressInRegister local_250;
  allocator<char> local_229;
  string local_228;
  AddressRegister local_208;
  AddressRegister local_1f8;
  allocator<md::AddressRegister> local_1e1;
  AddressRegister local_1e0;
  AddressRegister local_1d0;
  iterator local_1c0;
  size_type local_1b8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_1b0;
  allocator<md::DataRegister> local_191;
  DataRegister local_190;
  DataRegister local_180;
  iterator local_170;
  size_type local_168;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_160;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  AddressRegister local_f8;
  allocator<char> local_e1;
  string local_e0;
  Param local_c0 [4];
  AddressRegister local_a0;
  undefined1 local_90 [8];
  Code func;
  ROM *rom_local;
  PatchCredits *this_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_90);
  md::AddressRegister::AddressRegister(&local_a0,'\x01');
  md::Code::lea((Code *)local_90,0xff0080,&local_a0);
  addr_<void>((uint32_t)local_c0,0xff001c);
  md::Code::cmpib((Code *)local_90,'\x02',local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"not_arg",&local_e1);
  md::Code::bne((Code *)local_90,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  uVar1 = this->_red_credits_palette_addr;
  md::AddressRegister::AddressRegister(&local_f8,'\0');
  md::Code::lea((Code *)local_90,uVar1,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"ret",&local_119);
  md::Code::bra((Code *)local_90,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"not_arg",&local_141);
  md::Code::label((Code *)local_90,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  md::DataRegister::DataRegister(&local_190,'\0');
  md::DataRegister::DataRegister(&local_180,'\x01');
  local_170 = &local_190;
  local_168 = 2;
  std::allocator<md::DataRegister>::allocator(&local_191);
  __l_04._M_len = local_168;
  __l_04._M_array = local_170;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_160,__l_04,&local_191);
  md::AddressRegister::AddressRegister(&local_1e0,'\0');
  md::AddressRegister::AddressRegister(&local_1d0,'\x01');
  local_1c0 = &local_1e0;
  local_1b8 = 2;
  std::allocator<md::AddressRegister>::allocator(&local_1e1);
  __l_03._M_len = local_1b8;
  __l_03._M_array = local_1c0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_1b0,__l_03,&local_1e1);
  md::Code::movem_to_stack((Code *)local_90,&local_160,&local_1b0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_1b0);
  std::allocator<md::AddressRegister>::~allocator(&local_1e1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_160);
  std::allocator<md::DataRegister>::~allocator(&local_191);
  md::AddressRegister::AddressRegister(&local_1f8,'\0');
  md::Code::lea((Code *)local_90,0xff1060,&local_1f8);
  uVar1 = this->_all_checks_bytes_addr;
  md::AddressRegister::AddressRegister(&local_208,'\x01');
  md::Code::lea((Code *)local_90,uVar1,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"checks_loop",&local_229);
  md::Code::label((Code *)local_90,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  md::AddressRegister::AddressRegister(&local_260,'\0');
  addr_postinc_<void>(&local_250,&local_260);
  md::DataRegister::DataRegister(&local_270,'\0');
  md::Code::movew((Code *)local_90,&local_250.super_Param,(Param *)&local_270);
  md::AddressRegister::AddressRegister(&local_2a0,'\x01');
  addr_postinc_<void>(&local_290,&local_2a0);
  md::DataRegister::DataRegister(&local_2b0,'\x01');
  md::Code::movew((Code *)local_90,&local_290.super_Param,(Param *)&local_2b0);
  md::DataRegister::DataRegister(&local_2c0,'\x01');
  md::DataRegister::DataRegister(&local_2d0,'\0');
  md::Code::andw((Code *)local_90,(Param *)&local_2c0,&local_2d0);
  md::DataRegister::DataRegister(&local_2e0,'\x01');
  md::DataRegister::DataRegister(&local_2f0,'\0');
  md::Code::cmpw((Code *)local_90,(Param *)&local_2e0,&local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"not_all_checks",&local_311);
  md::Code::bne((Code *)local_90,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  md::AddressRegister::AddressRegister(&local_328,'\0');
  md::Code::cmpa((Code *)local_90,0xff109c,&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"checks_loop",&local_349);
  md::Code::blt((Code *)local_90,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  md::DataRegister::DataRegister(&local_398,'\0');
  md::DataRegister::DataRegister(&local_388,'\x01');
  local_378 = &local_398;
  local_370 = 2;
  std::allocator<md::DataRegister>::allocator(&local_399);
  __l_02._M_len = local_370;
  __l_02._M_array = local_378;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_368,__l_02,&local_399);
  md::AddressRegister::AddressRegister(&local_3e8,'\0');
  md::AddressRegister::AddressRegister(&local_3d8,'\x01');
  local_3c8 = &local_3e8;
  local_3c0 = 2;
  std::allocator<md::AddressRegister>::allocator(&local_3e9);
  __l_01._M_len = local_3c0;
  __l_01._M_array = local_3c8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_3b8,__l_01,&local_3e9);
  md::Code::movem_from_stack((Code *)local_90,&local_368,&local_3b8);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_3b8);
  std::allocator<md::AddressRegister>::~allocator(&local_3e9);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_368);
  std::allocator<md::DataRegister>::~allocator(&local_399);
  uVar1 = this->_gold_credits_palette_addr;
  md::AddressRegister::AddressRegister(&local_400,'\0');
  md::Code::lea((Code *)local_90,uVar1,&local_400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"ret",&local_421);
  md::Code::bra((Code *)local_90,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"not_all_checks",&local_449);
  md::Code::label((Code *)local_90,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  md::DataRegister::DataRegister(&local_498,'\0');
  md::DataRegister::DataRegister(&local_488,'\x01');
  local_478 = &local_498;
  local_470 = 2;
  std::allocator<md::DataRegister>::allocator(&local_499);
  __l_00._M_len = local_470;
  __l_00._M_array = local_478;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_468,__l_00,&local_499);
  md::AddressRegister::AddressRegister(&local_4e8,'\0');
  md::AddressRegister::AddressRegister(&local_4d8,'\x01');
  local_4c8 = &local_4e8;
  local_4c0 = 2;
  std::allocator<md::AddressRegister>::allocator(&local_4e9);
  __l._M_len = local_4c0;
  __l._M_array = local_4c8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_4b8,__l,&local_4e9);
  md::Code::movem_from_stack((Code *)local_90,&local_468,&local_4b8);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_4b8);
  std::allocator<md::AddressRegister>::~allocator(&local_4e9);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_468);
  std::allocator<md::DataRegister>::~allocator(&local_499);
  addr_<void>((uint32_t)local_500,0xff107d);
  md::Code::btst((Code *)local_90,'\0',local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"ret",&local_521);
  md::Code::beq((Code *)local_90,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  uVar1 = this->_blue_credits_palette_addr;
  md::AddressRegister::AddressRegister(&local_538,'\0');
  md::Code::lea((Code *)local_90,uVar1,&local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"ret",&local_559);
  md::Code::label((Code *)local_90,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  md::Code::rts((Code *)local_90);
  this_00 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"",&local_581);
  uVar1 = md::ROM::inject_code((ROM *)this_00,(Code *)local_90,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

uint32_t inject_func_choose_ending_palette(md::ROM& rom)
    {
        md::Code func;
        {
            func.lea(0xFF0080, reg_A1); // instruction erased by the jsr
            func.cmpib(2, addr_(0xFF001C));
            func.bne("not_arg");
            {
                func.lea(_red_credits_palette_addr, reg_A0); // Use red credits palette if Dark Gola has been beaten
                func.bra("ret");
            }
            func.label("not_arg");
            func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
            func.lea(0xFF1060, reg_A0);
            func.lea(_all_checks_bytes_addr, reg_A1);
            func.label("checks_loop");
            {
                func.movew(addr_postinc_(reg_A0), reg_D0);  // A0/D0 = cursor on check flags
                func.movew(addr_postinc_(reg_A1), reg_D1);  // A1/D1 = cursor on target values
                func.andw(reg_D1, reg_D0);                  // Check if D0 contains at least all bits set in D1
                func.cmpw(reg_D1, reg_D0);
                func.bne("not_all_checks");                 // If at least one is not equal, don't give golden ending
                func.cmpa(0xFF109C, reg_A0);
                func.blt("checks_loop");
                func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
                func.lea(_gold_credits_palette_addr, reg_A0); // Everything was collected, give the golden credits
                func.bra("ret");
            }

            func.label("not_all_checks");
            func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
            func.btst(FLAG_USED_BLUE_RIBBON.bit, addr_(0xFF1000 + FLAG_USED_BLUE_RIBBON.byte));
            func.beq("ret");
            {
                func.lea(_blue_credits_palette_addr, reg_A0); // Use blue credits palette if blue ribbon is held
            }
            func.label("ret");
        }
        func.rts();
        return rom.inject_code(func);
    }